

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::sortCircle(Circle *circles,int noCircles)

{
  undefined1 local_b8 [8];
  Circle t;
  int j;
  int max;
  int i;
  int noCircles_local;
  Circle *circles_local;
  
  for (j = 0; j < noCircles + -1; j = j + 1) {
    t.minorAxisLength._4_4_ = j;
    t.minorAxisLength._0_4_ = j;
    while (t.minorAxisLength._0_4_ = t.minorAxisLength._0_4_ + 1,
          t.minorAxisLength._0_4_ < noCircles) {
      if (circles[t.minorAxisLength._4_4_].r <= circles[t.minorAxisLength._0_4_].r &&
          circles[t.minorAxisLength._0_4_].r != circles[t.minorAxisLength._4_4_].r) {
        t.minorAxisLength._4_4_ = t.minorAxisLength._0_4_;
      }
    }
    if (t.minorAxisLength._4_4_ != j) {
      memcpy(local_b8,circles + j,0x98);
      memcpy(circles + j,circles + t.minorAxisLength._4_4_,0x98);
      memcpy(circles + t.minorAxisLength._4_4_,local_b8,0x98);
    }
  }
  return;
}

Assistant:

void EDCircles::sortCircle(Circle * circles, int noCircles)
{
	for (int i = 0; i<noCircles - 1; i++) {
		int max = i;
		for (int j = i + 1; j<noCircles; j++) {
			if (circles[j].r > circles[max].r) max = j;
		} //end-for

		if (max != i) {
			Circle t = circles[i];
			circles[i] = circles[max];
			circles[max] = t;
		} // end-if
	} //end-for
}